

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O3

void __thiscall
duckdb::BatchInsertGlobalState::ScheduleMergeTasks
          (BatchInsertGlobalState *this,ClientContext *context,idx_t min_batch_index)

{
  vector<duckdb::RowGroupBatchEntry,_true> *this_00;
  idx_t iVar1;
  pointer pRVar2;
  _func_int **pp_Var3;
  iterator iVar4;
  RowGroupBatchEntry *pRVar5;
  BatchInsertGlobalState *pBVar6;
  bool bVar7;
  int iVar8;
  reference pvVar9;
  undefined4 extraout_var;
  RowGroupCollection *this_01;
  reference pvVar10;
  reference pvVar11;
  long lVar12;
  long lVar13;
  InternalException *this_02;
  pointer pRVar14;
  size_t __n;
  ulong uVar15;
  ulong uVar16;
  pointer pBVar17;
  pointer pRVar18;
  size_type __n_00;
  vector<duckdb::BatchMergeTask,_true> to_be_scheduled_tasks;
  RowGroupBatchEntry added_entry;
  vector<duckdb::BatchMergeTask,_true> local_e8;
  BatchMergeTask local_c8;
  _Head_base<0UL,_duckdb::BatchInsertTask_*,_false> local_b0;
  _func_int **local_a8;
  iterator iStack_a0;
  RowGroupBatchEntry *local_98;
  BatchInsertGlobalState *local_88;
  undefined1 local_80 [32];
  RowGroupBatchType local_60;
  uint7 uStack_5f;
  _func_int **local_58;
  BatchTaskManager<duckdb::BatchInsertTask> *local_50;
  BatchMergeTask *local_48;
  _func_int **local_40;
  ClientContext *local_38;
  
  local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
  super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
  super__Vector_impl_data._M_start = (BatchMergeTask *)0x0;
  local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
  super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
  super__Vector_impl_data._M_finish = (BatchMergeTask *)0x0;
  local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
  super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (BatchMergeTask *)0x0;
  uVar15 = this->next_start;
  local_c8.end_index = 0;
  local_c8.total_count = 0;
  this_00 = &this->collections;
  local_c8.start_index = uVar15;
  local_38 = context;
  if (uVar15 < (ulong)(((long)(this->collections).
                              super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                              .
                              super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->collections).
                              super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                              .
                              super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333)
     ) {
    do {
      pvVar9 = vector<duckdb::RowGroupBatchEntry,_true>::operator[](this_00,uVar15);
      if (min_batch_index < pvVar9->batch_idx) {
        bVar7 = ReadyToMerge(this,local_c8.total_count);
        if (bVar7) {
          if (local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_c8.end_index = uVar15;
            ::std::vector<duckdb::BatchMergeTask,std::allocator<duckdb::BatchMergeTask>>::
            _M_realloc_insert<duckdb::BatchMergeTask_const&>
                      ((vector<duckdb::BatchMergeTask,std::allocator<duckdb::BatchMergeTask>> *)
                       &local_e8,
                       (iterator)
                       local_e8.
                       super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                       .
                       super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_c8);
          }
          else {
            (local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish)->total_count = local_c8.total_count;
            (local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish)->start_index = local_c8.start_index;
            (local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish)->end_index = uVar15;
            local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
            super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_e8.
                 super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                 super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            local_c8.end_index = uVar15;
          }
        }
        break;
      }
      if (pvVar9->type == FLUSHED) {
        if (local_c8.total_count != 0) {
          if (local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_c8.end_index = uVar15;
            ::std::vector<duckdb::BatchMergeTask,std::allocator<duckdb::BatchMergeTask>>::
            _M_realloc_insert<duckdb::BatchMergeTask_const&>
                      ((vector<duckdb::BatchMergeTask,std::allocator<duckdb::BatchMergeTask>> *)
                       &local_e8,
                       (iterator)
                       local_e8.
                       super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                       .
                       super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_c8);
          }
          else {
            (local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish)->total_count = local_c8.total_count;
            (local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish)->start_index = local_c8.start_index;
            (local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish)->end_index = uVar15;
            local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
            super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_e8.
                 super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                 super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            local_c8.end_index = uVar15;
          }
        }
        if (this->next_start <= uVar15) {
          this->next_start = uVar15 + 1;
        }
LAB_016bfbf4:
        local_c8.start_index = uVar15 + 1;
        local_c8.total_count = 0;
      }
      else {
        local_c8.total_count = local_c8.total_count + pvVar9->total_rows;
        bVar7 = ReadyToMerge(this,local_c8.total_count);
        uVar16 = uVar15 + 1;
        if (bVar7) {
          local_c8.end_index = uVar16;
          if (local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<duckdb::BatchMergeTask,std::allocator<duckdb::BatchMergeTask>>::
            _M_realloc_insert<duckdb::BatchMergeTask_const&>
                      ((vector<duckdb::BatchMergeTask,std::allocator<duckdb::BatchMergeTask>> *)
                       &local_e8,
                       (iterator)
                       local_e8.
                       super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                       .
                       super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_c8);
          }
          else {
            (local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish)->total_count = local_c8.total_count;
            (local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish)->start_index = local_c8.start_index;
            (local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish)->end_index = uVar16;
            local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
            super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_e8.
                 super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                 super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          goto LAB_016bfbf4;
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)(((long)(this->collections).
                                     super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                                     .
                                     super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->collections).
                                     super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                                     .
                                     super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x3333333333333333));
  }
  local_48 = local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
      super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
      super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_50 = &this->task_manager;
    local_58 = (_func_int **)&PTR__MergeCollectionTask_02465c30;
    pBVar17 = local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_88 = this;
    do {
      pvVar9 = vector<duckdb::RowGroupBatchEntry,_true>::operator[](this_00,pBVar17->start_index);
      local_40 = (_func_int **)pvVar9->batch_idx;
      local_a8 = (_func_int **)0x0;
      iStack_a0._M_current = (RowGroupBatchEntry *)0x0;
      local_98 = (RowGroupBatchEntry *)0x0;
      uVar15 = pBVar17->start_index;
      if (uVar15 < pBVar17->end_index) {
        do {
          pvVar9 = vector<duckdb::RowGroupBatchEntry,_true>::operator[](this_00,uVar15);
          if (((pvVar9->collection_index).index == 0xffffffffffffffff) || (pvVar9->type == FLUSHED))
          {
            this_02 = (InternalException *)__cxa_allocate_exception(0x10);
            local_80._0_8_ = local_80 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_80,"Adding a row group collection that should not be flushed"
                       ,"");
            InternalException::InternalException(this_02,(string *)local_80);
            __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          iVar8 = (*(this->table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
                    super_CatalogEntry._vptr_CatalogEntry[0x10])();
          this_01 = DataTable::GetOptimisticCollection
                              ((DataTable *)CONCAT44(extraout_var,iVar8),local_38,
                               (PhysicalIndex)(pvVar9->collection_index).index);
          pvVar10 = vector<duckdb::RowGroupBatchEntry,_true>::operator[]
                              (this_00,pBVar17->start_index);
          local_80._0_8_ = pvVar10->batch_idx;
          iVar1 = (pvVar9->collection_index).index;
          local_80._8_8_ = RowGroupCollection::GetTotalRows(this_01);
          local_60 = FLUSHED;
          local_80._16_8_ = pvVar9->unflushed_memory;
          local_80._24_8_ = iVar1;
          if (iStack_a0._M_current == local_98) {
            ::std::vector<duckdb::RowGroupBatchEntry,std::allocator<duckdb::RowGroupBatchEntry>>::
            _M_realloc_insert<duckdb::RowGroupBatchEntry_const&>
                      ((vector<duckdb::RowGroupBatchEntry,std::allocator<duckdb::RowGroupBatchEntry>>
                        *)&local_a8,iStack_a0,(RowGroupBatchEntry *)local_80);
          }
          else {
            *(ulong *)&(iStack_a0._M_current)->type = (ulong)uStack_5f << 8;
            local_80._20_4_ = (undefined4)((ulong)local_80._16_8_ >> 0x20);
            local_80._24_4_ = (undefined4)iVar1;
            local_80._28_4_ = (undefined4)(iVar1 >> 0x20);
            *(undefined4 *)&(iStack_a0._M_current)->unflushed_memory = local_80._16_4_;
            *(undefined4 *)((long)&(iStack_a0._M_current)->unflushed_memory + 4) = local_80._20_4_;
            *(undefined4 *)&((iStack_a0._M_current)->collection_index).index = local_80._24_4_;
            *(undefined4 *)((long)&((iStack_a0._M_current)->collection_index).index + 4) =
                 local_80._28_4_;
            (iStack_a0._M_current)->batch_idx = local_80._0_8_;
            (iStack_a0._M_current)->total_rows = local_80._8_8_;
            iStack_a0._M_current = iStack_a0._M_current + 1;
          }
          pvVar9->total_rows = pBVar17->total_count;
          pvVar9->type = FLUSHED;
          (pvVar9->collection_index).index = 0xffffffffffffffff;
          uVar15 = uVar15 + 1;
          this = local_88;
        } while (uVar15 < pBVar17->end_index);
      }
      local_b0._M_head_impl = (BatchInsertTask *)operator_new(0x28);
      pRVar5 = local_98;
      iVar4._M_current = iStack_a0._M_current;
      pp_Var3 = local_a8;
      local_a8 = (_func_int **)0x0;
      iStack_a0._M_current = (RowGroupBatchEntry *)0x0;
      local_98 = (RowGroupBatchEntry *)0x0;
      (local_b0._M_head_impl)->_vptr_BatchInsertTask = local_58;
      local_b0._M_head_impl[1]._vptr_BatchInsertTask = pp_Var3;
      local_b0._M_head_impl[2]._vptr_BatchInsertTask = (_func_int **)iVar4._M_current;
      local_b0._M_head_impl[3]._vptr_BatchInsertTask = (_func_int **)pRVar5;
      local_b0._M_head_impl[4]._vptr_BatchInsertTask = local_40;
      BatchTaskManager<duckdb::BatchInsertTask>::AddTask
                (local_50,(unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>
                           *)&local_b0);
      if (local_b0._M_head_impl != (BatchInsertTask *)0x0) {
        (*(local_b0._M_head_impl)->_vptr_BatchInsertTask[1])();
      }
      local_b0._M_head_impl = (BatchInsertTask *)0x0;
      if (local_a8 != (_func_int **)0x0) {
        operator_delete(local_a8);
      }
      pBVar17 = pBVar17 + 1;
    } while (pBVar17 != local_48);
    if ((long)local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      __n_00 = ((long)local_e8.
                      super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                      super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_e8.
                      super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                      super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      do {
        __n_00 = __n_00 - 1;
        pvVar11 = vector<duckdb::BatchMergeTask,_true>::operator[](&local_e8,__n_00);
        if (pvVar11->start_index + 1 < pvVar11->end_index) {
          pRVar18 = (this_00->
                    super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                    ).
                    super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar12 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar11->start_index);
          pRVar2 = (this_00->
                   super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                   ).
                   super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar13 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar11->end_index);
          pBVar6 = local_88;
          pRVar18 = pRVar18 + lVar12 + 1;
          pRVar2 = pRVar2 + lVar13;
          if (pRVar18 != pRVar2) {
            __n = (long)(local_88->collections).
                        super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                        .
                        super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2;
            pRVar14 = pRVar2;
            if (__n != 0) {
              memmove(pRVar18,pRVar2,__n);
              pRVar14 = (pBVar6->collections).
                        super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                        .
                        super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            pRVar18 = (pointer)((long)pRVar18 + ((long)pRVar14 - (long)pRVar2));
            if (pRVar14 != pRVar18) {
              (local_88->collections).
              super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
              super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish = pRVar18;
            }
          }
        }
      } while (__n_00 != 0);
    }
  }
  if (local_e8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
      super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
      super__Vector_impl_data._M_start != (BatchMergeTask *)0x0) {
    operator_delete(local_e8.
                    super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                    super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BatchInsertGlobalState::ScheduleMergeTasks(ClientContext &context, const idx_t min_batch_index) {
	idx_t current_idx;
	vector<BatchMergeTask> to_be_scheduled_tasks;

	BatchMergeTask current_task(next_start);
	for (current_idx = current_task.start_index; current_idx < collections.size(); current_idx++) {
		auto &entry = collections[current_idx];
		if (entry.batch_idx > min_batch_index) {
			// this entry is AFTER the min_batch_index
			// finished
			if (ReadyToMerge(current_task.total_count)) {
				current_task.end_index = current_idx;
				to_be_scheduled_tasks.push_back(current_task);
			}
			break;
		}
		if (entry.type == RowGroupBatchType::FLUSHED) {
			// already flushed: cannot flush anything here
			if (current_task.total_count > 0) {
				current_task.end_index = current_idx;
				to_be_scheduled_tasks.push_back(current_task);
			}
			current_task.start_index = current_idx + 1;
			if (current_task.start_index > next_start) {
				// avoid checking this segment again in the future
				next_start = current_task.start_index;
			}
			current_task.total_count = 0;
			continue;
		}
		// not flushed - add to set of indexes to flush
		current_task.total_count += entry.total_rows;
		if (ReadyToMerge(current_task.total_count)) {
			// create a task to merge these collections
			current_task.end_index = current_idx + 1;
			to_be_scheduled_tasks.push_back(current_task);
			current_task.start_index = current_idx + 1;
			current_task.total_count = 0;
		}
	}

	if (to_be_scheduled_tasks.empty()) {
		return;
	}
	for (auto &scheduled_task : to_be_scheduled_tasks) {
		D_ASSERT(scheduled_task.total_count > 0);
		D_ASSERT(current_idx > scheduled_task.start_index);
		auto merged_batch_index = collections[scheduled_task.start_index].batch_idx;
		vector<RowGroupBatchEntry> merge_collections;
		for (idx_t idx = scheduled_task.start_index; idx < scheduled_task.end_index; idx++) {
			auto &entry = collections[idx];
			if (!entry.collection_index.IsValid() || entry.type == RowGroupBatchType::FLUSHED) {
				throw InternalException("Adding a row group collection that should not be flushed");
			}
			auto &collection = table.GetStorage().GetOptimisticCollection(context, entry.collection_index);
			RowGroupBatchEntry added_entry(collection, collections[scheduled_task.start_index].batch_idx,
			                               entry.collection_index, RowGroupBatchType::FLUSHED);
			added_entry.unflushed_memory = entry.unflushed_memory;
			merge_collections.push_back(added_entry);
			entry.total_rows = scheduled_task.total_count;
			entry.type = RowGroupBatchType::FLUSHED;
			entry.collection_index = PhysicalIndex(DConstants::INVALID_INDEX);
		}
		task_manager.AddTask(make_uniq<MergeCollectionTask>(std::move(merge_collections), merged_batch_index));
	}
	// erase in reverse order
	for (idx_t i = to_be_scheduled_tasks.size(); i > 0; i--) {
		auto &scheduled_task = to_be_scheduled_tasks[i - 1];
		if (scheduled_task.start_index + 1 < scheduled_task.end_index) {
			// erase all entries except the first one
			collections.erase(collections.begin() + NumericCast<int64_t>(scheduled_task.start_index) + 1,
			                  collections.begin() + NumericCast<int64_t>(scheduled_task.end_index));
		}
	}
}